

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_QHashDummyValue>_>::rehash
          (Data<QHashPrivate::Node<ProKey,_QHashDummyValue>_> *this,size_t sizeHint)

{
  ulong uVar1;
  Span *pSVar2;
  ulong uVar3;
  ProString *this_00;
  ulong uVar4;
  size_t index;
  long lVar5;
  Span *pSVar6;
  size_t sVar7;
  ProString *str;
  long lVar8;
  R RVar9;
  Bucket BVar10;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar7 = 0x80;
  if ((0x40 < sizeHint) && (sVar7 = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar5 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    sVar7 = 1L << (0x41 - ((byte)lVar5 ^ 0x3f) & 0x3f);
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar9 = allocateSpans(sVar7);
  this->spans = (Span *)RVar9.spans;
  this->numBuckets = sVar7;
  if (uVar1 < 0x80) {
    if (pSVar2 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar4 = 0;
    pSVar6 = pSVar2;
    do {
      lVar5 = 0;
      do {
        if (pSVar6->offsets[lVar5] != 0xff) {
          str = (ProString *)
                (((pSVar2[uVar4].entries)->storage).data + (uint)pSVar6->offsets[lVar5] * 0x30);
          uVar3 = this->seed;
          sVar7 = qHash(str);
          BVar10 = findBucketWithHash<ProKey>(this,(ProKey *)str,uVar3 ^ sVar7);
          this_00 = (ProString *)
                    Span<QHashPrivate::Node<ProKey,_QHashDummyValue>_>::insert
                              (BVar10.span,BVar10.index);
          ProString::ProString(this_00,str);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x80);
      Span<QHashPrivate::Node<ProKey,_QHashDummyValue>_>::freeData(pSVar2 + uVar4);
      uVar4 = uVar4 + 1;
      pSVar6 = pSVar6 + 1;
    } while (uVar4 != uVar1 >> 7);
  }
  lVar5 = *(long *)&pSVar2[-1].allocated;
  if (lVar5 != 0) {
    lVar8 = lVar5 * 0x90;
    do {
      Span<QHashPrivate::Node<ProKey,_QHashDummyValue>_>::freeData
                ((Span<QHashPrivate::Node<ProKey,_QHashDummyValue>_> *)(pSVar2[-1].offsets + lVar8))
      ;
      lVar8 = lVar8 + -0x90;
    } while (lVar8 != 0);
  }
  operator_delete__(&pSVar2[-1].allocated,lVar5 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }